

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

bool __thiscall pbrt::Transform::HasScale(Transform *this,Float tolerance)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Float FVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  fVar1 = (this->m).m[0][0];
  fVar2 = (this->m).m[0][1];
  auVar16 = ZEXT816(0) << 0x40;
  fVar10 = fVar2 * 0.0;
  fVar3 = (this->m).m[0][2];
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 + fVar10)),ZEXT416((uint)fVar3),auVar16);
  fVar4 = (this->m).m[1][0];
  fVar5 = (this->m).m[1][1];
  fVar11 = fVar5 * 0.0;
  fVar6 = (this->m).m[1][2];
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 + fVar11)),ZEXT416((uint)fVar6),auVar16);
  FVar7 = (this->m).m[2][0];
  fVar8 = (this->m).m[2][1];
  auVar17 = ZEXT416((uint)(fVar8 * 0.0));
  auVar13 = vaddss_avx512f(ZEXT416((uint)FVar7),auVar17);
  fVar9 = (this->m).m[2][2];
  auVar13 = vfmadd231ss_avx512f(auVar13,ZEXT416((uint)fVar9),auVar16);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * auVar14._0_4_)),auVar15,auVar15);
  auVar14 = vfmadd231ss_avx512f(auVar15,auVar13,auVar13);
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx512vl(ZEXT416((uint)(auVar14._0_4_ + -1.0)),auVar15);
  bVar12 = true;
  if (auVar15._0_4_ <= tolerance) {
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)FVar7),auVar16);
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar9),auVar16);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),auVar16);
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar3),auVar16);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar4),auVar16);
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar6),auVar16);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * auVar13._0_4_)),auVar14,auVar14);
    auVar15 = vfmadd231ss_fma(auVar14,auVar15,auVar15);
    auVar14._8_4_ = 0x7fffffff;
    auVar14._0_8_ = 0x7fffffff7fffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar15 = vandps_avx512vl(ZEXT416((uint)(auVar15._0_4_ + -1.0)),auVar14);
    if (auVar15._0_4_ <= tolerance) {
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar16,ZEXT416((uint)fVar10));
      auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar16,ZEXT416((uint)fVar11));
      fVar6 = fVar6 + auVar14._0_4_;
      auVar14 = vfmadd213ss_fma(ZEXT416((uint)FVar7),auVar16,auVar17);
      auVar15 = ZEXT416((uint)(fVar3 + auVar15._0_4_));
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),auVar15,auVar15);
      auVar14 = ZEXT416((uint)(fVar9 + auVar14._0_4_));
      auVar15 = vfmadd231ss_fma(auVar15,auVar14,auVar14);
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar15 = vandps_avx512vl(ZEXT416((uint)(auVar15._0_4_ + -1.0)),auVar13);
      bVar12 = tolerance < auVar15._0_4_;
    }
  }
  return bVar12;
}

Assistant:

inline Vector3<T> Transform::operator()(const Vector3<T> &v) const {
    T x = v.x, y = v.y, z = v.z;
    return Vector3<T>(m[0][0] * x + m[0][1] * y + m[0][2] * z,
                      m[1][0] * x + m[1][1] * y + m[1][2] * z,
                      m[2][0] * x + m[2][1] * y + m[2][2] * z);
}